

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::ImmutableMapFieldGenerator
          (ImmutableMapFieldGenerator *this,FieldDescriptor *descriptor,int messageBitIndex,
          int builderBitIndex,Context *context)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  _Rb_tree_header *p_Var1;
  undefined8 *puVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  char cVar6;
  undefined8 uVar7;
  pointer pcVar8;
  long lVar9;
  undefined8 uVar10;
  long lVar11;
  bool bVar12;
  JavaType type;
  JavaType type_00;
  ClassNameResolver *pCVar13;
  FieldGeneratorInfo *info;
  Descriptor *pDVar14;
  mapped_type *pmVar15;
  LogMessage *pLVar16;
  FieldDescriptor *pFVar17;
  undefined8 *puVar18;
  long *plVar19;
  char *pcVar20;
  long *plVar21;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar22;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *pFVar23;
  Descriptor *descriptor_00;
  ulong uVar24;
  _Alloc_hider _Var25;
  Context *name_resolver;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  size_type __dnew_1;
  size_type __dnew;
  size_type __dnew_8;
  string boxed_key_type;
  size_type __dnew_3;
  key_type local_1a8;
  key_type local_188;
  FieldDescriptor *local_168;
  FieldDescriptor *local_160;
  key_type local_158;
  uint local_134;
  FieldDescriptor *local_130;
  key_type local_128;
  string local_108;
  key_type local_e8;
  ImmutableMapFieldGenerator *local_c8;
  undefined1 local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0 [2];
  undefined1 local_88 [56];
  key_type local_50;
  
  (this->super_ImmutableFieldGenerator)._vptr_ImmutableFieldGenerator =
       (_func_int **)&PTR__ImmutableMapFieldGenerator_0046f738;
  this->descriptor_ = descriptor;
  variables = &this->variables_;
  p_Var1 = &(this->variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  name_resolver = context;
  local_160 = descriptor;
  local_134 = builderBitIndex;
  local_c8 = this;
  pCVar13 = Context::GetNameResolver(context);
  local_c8->name_resolver_ = pCVar13;
  info = Context::GetFieldGeneratorInfo(context,local_160);
  SetCommonFieldVariables(local_160,info,variables);
  local_168 = (FieldDescriptor *)Context::GetNameResolver(context);
  pDVar14 = FieldDescriptor::message_type(local_160);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_88,(ClassNameResolver *)local_168,pDVar14,true);
  local_b0[0]._M_allocated_capacity._0_4_ = 0x65707974;
  local_c0._8_8_ = (char *)0x4;
  local_b0[0]._M_local_buf[4] = '\0';
  local_c0._0_8_ = (FieldDescriptor *)(local_c0 + 0x10);
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_c0);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)local_88);
  pFVar17 = local_160;
  if ((FieldDescriptor *)local_c0._0_8_ != (FieldDescriptor *)(local_c0 + 0x10)) {
    operator_delete((void *)local_c0._0_8_);
  }
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_);
  }
  if (*(once_flag **)(pFVar17 + 0x30) != (once_flag *)0x0) {
    local_88._0_8_ = FieldDescriptor::TypeOnceInit;
    local_c0._0_8_ = pFVar17;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar17 + 0x30),(_func_void_FieldDescriptor_ptr **)local_88,
               (FieldDescriptor **)local_c0);
    pFVar17 = local_160;
  }
  if (*(int *)(pFVar17 + 0x38) != 0xb) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_88,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/java/java_map_field.cc"
               ,0x2f);
    pLVar16 = internal::LogMessage::operator<<
                        ((LogMessage *)local_88,
                         "CHECK failed: (FieldDescriptor::TYPE_MESSAGE) == (descriptor->type()): ");
    internal::LogFinisher::operator=((LogFinisher *)local_c0,pLVar16);
    pFVar17 = local_160;
    internal::LogMessage::~LogMessage((LogMessage *)local_88);
  }
  pDVar14 = FieldDescriptor::message_type(pFVar17);
  if (*(char *)(*(long *)(pDVar14 + 0x20) + 0x4b) == '\0') {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_c0,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/java/java_map_field.cc"
               ,0x31);
    pLVar16 = internal::LogMessage::operator<<
                        ((LogMessage *)local_c0,"CHECK failed: message->options().map_entry(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_108,pLVar16);
    internal::LogMessage::~LogMessage((LogMessage *)local_c0);
  }
  paVar5 = &local_108.field_2;
  local_108.field_2._M_allocated_capacity._0_4_ = 0x79656b;
  local_108._M_string_length = 3;
  local_108._M_dataplus._M_p = (pointer)paVar5;
  pFVar17 = Descriptor::FindFieldByName(pDVar14,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar5) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  local_130 = anon_unknown_1::ValueField(local_160);
  type = GetJavaType(pFVar17);
  type_00 = GetJavaType(local_130);
  (anonymous_namespace)::TypeName_abi_cxx11_
            (&local_108,(_anonymous_namespace_ *)pFVar17,local_168,(ClassNameResolver *)0x0,
             SUB81(name_resolver,0));
  paVar3 = &local_1a8.field_2;
  local_1a8.field_2._M_allocated_capacity._0_2_ = 0x656b;
  local_1a8.field_2._M_local_buf[2] = 'y';
  local_1a8.field_2._M_allocated_capacity._3_2_ = 0x745f;
  local_1a8.field_2._M_local_buf[5] = 'y';
  local_1a8.field_2._M_local_buf[6] = 'p';
  local_1a8.field_2._M_local_buf[7] = 'e';
  local_1a8._M_string_length = 8;
  local_1a8.field_2._M_local_buf[8] = '\0';
  local_1a8._M_dataplus._M_p = (pointer)paVar3;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_1a8);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar5) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  (anonymous_namespace)::TypeName_abi_cxx11_
            (&local_108,(_anonymous_namespace_ *)pFVar17,local_168,(ClassNameResolver *)0x1,
             SUB81(name_resolver,0));
  local_1a8.field_2._M_allocated_capacity._0_2_ = 0x6f62;
  local_1a8.field_2._M_local_buf[2] = 'x';
  local_1a8.field_2._M_allocated_capacity._3_2_ = 0x6465;
  local_1a8.field_2._M_local_buf[5] = '_';
  local_1a8.field_2._M_local_buf[6] = 'k';
  local_1a8.field_2._M_local_buf[7] = 'e';
  local_1a8.field_2._M_local_buf[8] = 'y';
  local_1a8.field_2._M_local_buf[9] = '_';
  local_1a8.field_2._M_local_buf[10] = 't';
  local_1a8.field_2._M_local_buf[0xb] = 'y';
  local_1a8.field_2._M_local_buf[0xc] = 'p';
  local_1a8.field_2._M_local_buf[0xd] = 'e';
  local_1a8._M_string_length = 0xe;
  local_1a8.field_2._M_local_buf[0xe] = '\0';
  local_1a8._M_dataplus._M_p = (pointer)paVar3;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_1a8);
  std::__cxx11::string::_M_assign((string *)pmVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  std::__cxx11::string::rfind((char)&local_108,0x2e);
  std::__cxx11::string::substr((ulong)&local_1a8,(ulong)&local_108);
  paVar5 = &local_188.field_2;
  local_188.field_2._M_allocated_capacity._0_4_ = 0x726f6873;
  local_188.field_2._M_local_buf[4] = 't';
  local_188.field_2._M_local_buf[5] = '_';
  local_188.field_2._M_local_buf[6] = 'k';
  local_188.field_2._M_local_buf[7] = 'e';
  local_188.field_2._8_2_ = 0x5f79;
  local_188.field_2._M_local_buf[10] = 't';
  local_188.field_2._11_2_ = 0x7079;
  local_188.field_2._M_local_buf[0xd] = 'e';
  local_188._M_string_length = 0xe;
  local_188.field_2._M_local_buf[0xe] = '\0';
  local_188._M_dataplus._M_p = (pointer)paVar5;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_188);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_1a8);
  pFVar23 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar5) {
    operator_delete(local_188._M_dataplus._M_p);
    pFVar23 = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a8._M_dataplus._M_p);
    pFVar23 = extraout_RDX_01;
  }
  (anonymous_namespace)::WireType_abi_cxx11_(&local_1a8,(_anonymous_namespace_ *)pFVar17,pFVar23);
  local_188.field_2._M_allocated_capacity._0_4_ = 0x5f79656b;
  local_188.field_2._M_local_buf[4] = 'w';
  local_188.field_2._M_local_buf[5] = 'i';
  local_188.field_2._M_local_buf[6] = 'r';
  local_188.field_2._M_local_buf[7] = 'e';
  local_188.field_2._8_2_ = 0x745f;
  local_188.field_2._M_local_buf[10] = 'y';
  local_188.field_2._11_2_ = 0x6570;
  local_188._M_string_length = 0xd;
  local_188.field_2._M_local_buf[0xd] = '\0';
  local_188._M_dataplus._M_p = (pointer)paVar5;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_188);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar5) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  DefaultValue_abi_cxx11_
            (&local_1a8,(java *)pFVar17,(FieldDescriptor *)0x1,SUB81(local_168,0),
             (ClassNameResolver *)name_resolver);
  local_158._M_dataplus._M_p = (pointer)0x11;
  local_188._M_dataplus._M_p = (pointer)paVar5;
  local_188._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_188,(ulong)&local_158);
  local_188.field_2._M_allocated_capacity._0_4_ = SUB84(local_158._M_dataplus._M_p,0);
  local_188.field_2._M_local_buf[4] = (char)((ulong)local_158._M_dataplus._M_p >> 0x20);
  local_188.field_2._M_local_buf[5] = (char)((ulong)local_158._M_dataplus._M_p >> 0x28);
  local_188.field_2._M_local_buf[6] = (char)((ulong)local_158._M_dataplus._M_p >> 0x30);
  local_188.field_2._M_local_buf[7] = (char)((ulong)local_158._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_188._M_dataplus._M_p,"key_default_value",0x11);
  local_188._M_string_length = (size_type)local_158._M_dataplus._M_p;
  local_188._M_dataplus._M_p[(long)local_158._M_dataplus._M_p] = '\0';
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_188);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar5) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  bVar12 = IsReferenceType(type);
  local_1a8.field_2._M_allocated_capacity._0_2_ = 0x656b;
  local_1a8.field_2._M_local_buf[2] = 'y';
  local_1a8.field_2._M_allocated_capacity._3_2_ = 0x6e5f;
  local_1a8.field_2._M_local_buf[5] = 'u';
  local_1a8.field_2._M_local_buf[6] = 'l';
  local_1a8.field_2._M_local_buf[7] = 'l';
  local_1a8.field_2._M_local_buf[8] = '_';
  local_1a8.field_2._M_local_buf[9] = 'c';
  local_1a8.field_2._M_local_buf[10] = 'h';
  local_1a8.field_2._M_local_buf[0xb] = 'e';
  local_1a8.field_2._M_local_buf[0xc] = 'c';
  local_1a8.field_2._M_local_buf[0xd] = 'k';
  local_1a8._M_string_length = 0xe;
  local_1a8.field_2._M_local_buf[0xe] = '\0';
  local_1a8._M_dataplus._M_p = (pointer)paVar3;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_1a8);
  pcVar20 = "if (key == null) { throw new java.lang.NullPointerException(); }";
  if (!bVar12) {
    pcVar20 = "";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,(ulong)pcVar20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  bVar12 = IsReferenceType(type_00);
  pcVar20 = "if (value == null) { throw new java.lang.NullPointerException(); }";
  if (!bVar12) {
    pcVar20 = "";
  }
  local_188._M_dataplus._M_p = (pointer)0x10;
  local_1a8._M_dataplus._M_p = (pointer)paVar3;
  local_1a8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_1a8,(ulong)&local_188);
  local_1a8.field_2._M_allocated_capacity._0_2_ = SUB82(local_188._M_dataplus._M_p,0);
  local_1a8.field_2._M_local_buf[2] = (char)((ulong)local_188._M_dataplus._M_p >> 0x10);
  local_1a8.field_2._M_allocated_capacity._3_2_ =
       (undefined2)((ulong)local_188._M_dataplus._M_p >> 0x18);
  local_1a8.field_2._M_local_buf[5] = (char)((ulong)local_188._M_dataplus._M_p >> 0x28);
  local_1a8.field_2._M_local_buf[6] = (char)((ulong)local_188._M_dataplus._M_p >> 0x30);
  local_1a8.field_2._M_local_buf[7] = (char)((ulong)local_188._M_dataplus._M_p >> 0x38);
  *(undefined8 *)local_1a8._M_dataplus._M_p = 0x756e5f65756c6176;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p + 8) = 'l';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p + 9) = 'l';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p + 10) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p + 0xb) = 'c';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p + 0xc) = 'h';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p + 0xd) = 'e';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p + 0xe) = 'c';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p + 0xf) = 'k';
  local_1a8._M_string_length = (size_type)local_188._M_dataplus._M_p;
  local_1a8._M_dataplus._M_p[(long)local_188._M_dataplus._M_p] = '\0';
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_1a8);
  pCVar13 = (ClassNameResolver *)0x42;
  if (!bVar12) {
    pCVar13 = (ClassNameResolver *)0x0;
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,(ulong)pcVar20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  pFVar17 = local_130;
  if (type_00 == JAVATYPE_ENUM) {
    local_1a8.field_2._M_allocated_capacity._0_2_ = 0x6176;
    local_1a8.field_2._M_local_buf[2] = 'l';
    local_1a8.field_2._M_allocated_capacity._3_2_ = 0x6575;
    local_1a8.field_2._M_local_buf[5] = '_';
    local_1a8.field_2._M_local_buf[6] = 't';
    local_1a8.field_2._M_local_buf[7] = 'y';
    local_1a8.field_2._M_local_buf[8] = 'p';
    local_1a8.field_2._M_local_buf[9] = 'e';
    local_1a8._M_string_length = 10;
    local_1a8.field_2._M_local_buf[10] = '\0';
    local_1a8._M_dataplus._M_p = (pointer)paVar3;
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_1a8);
    pFVar17 = local_130;
    std::__cxx11::string::_M_replace((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x3a1819);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
    local_188._M_dataplus._M_p = (pointer)0x10;
    local_1a8._M_dataplus._M_p = (pointer)paVar3;
    local_1a8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_1a8,(ulong)&local_188);
    local_1a8.field_2._M_allocated_capacity._0_2_ = SUB82(local_188._M_dataplus._M_p,0);
    local_1a8.field_2._M_local_buf[2] = (char)((ulong)local_188._M_dataplus._M_p >> 0x10);
    local_1a8.field_2._M_allocated_capacity._3_2_ =
         (undefined2)((ulong)local_188._M_dataplus._M_p >> 0x18);
    local_1a8.field_2._M_local_buf[5] = (char)((ulong)local_188._M_dataplus._M_p >> 0x28);
    local_1a8.field_2._M_local_buf[6] = (char)((ulong)local_188._M_dataplus._M_p >> 0x30);
    local_1a8.field_2._M_local_buf[7] = (char)((ulong)local_188._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_1a8._M_dataplus._M_p,"boxed_value_type",0x10);
    local_1a8._M_string_length = (size_type)local_188._M_dataplus._M_p;
    local_1a8._M_dataplus._M_p[(long)local_188._M_dataplus._M_p] = '\0';
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_1a8);
    pCVar13 = (ClassNameResolver *)0x11;
    std::__cxx11::string::_M_replace((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x39af62);
    pFVar23 = extraout_RDX_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a8._M_dataplus._M_p);
      pFVar23 = extraout_RDX_03;
    }
    (anonymous_namespace)::WireType_abi_cxx11_(&local_1a8,(_anonymous_namespace_ *)pFVar17,pFVar23);
    local_188.field_2._M_allocated_capacity._0_4_ = 0x756c6176;
    local_188.field_2._M_local_buf[4] = 'e';
    local_188.field_2._M_local_buf[5] = '_';
    local_188.field_2._M_local_buf[6] = 'w';
    local_188.field_2._M_local_buf[7] = 'i';
    local_188.field_2._8_2_ = 0x6572;
    local_188.field_2._M_local_buf[10] = '_';
    local_188.field_2._11_2_ = 0x7974;
    local_188.field_2._M_local_buf[0xd] = 'p';
    local_188.field_2._M_local_buf[0xe] = 'e';
    local_188._M_string_length = 0xf;
    local_188.field_2._M_local_buf[0xf] = '\0';
    local_188._M_dataplus._M_p = (pointer)paVar5;
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_188);
    std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar5) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
    DefaultValue_abi_cxx11_
              (&local_188,(java *)pFVar17,(FieldDescriptor *)0x1,SUB81(local_168,0),pCVar13);
    puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
    pcVar20 = (char *)(puVar18 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar18 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar20) {
      uVar7 = *(undefined8 *)pcVar20;
      uVar10 = puVar18[3];
      local_1a8.field_2._M_allocated_capacity._0_2_ = (undefined2)uVar7;
      local_1a8.field_2._M_local_buf[2] = (char)((ulong)uVar7 >> 0x10);
      local_1a8.field_2._M_allocated_capacity._3_2_ = (undefined2)((ulong)uVar7 >> 0x18);
      local_1a8.field_2._M_local_buf[5] = (char)((ulong)uVar7 >> 0x28);
      local_1a8.field_2._M_local_buf[6] = (char)((ulong)uVar7 >> 0x30);
      local_1a8.field_2._M_local_buf[7] = (char)((ulong)uVar7 >> 0x38);
      local_1a8.field_2._M_local_buf[8] = (char)uVar10;
      local_1a8.field_2._M_local_buf[9] = (char)((ulong)uVar10 >> 8);
      local_1a8.field_2._M_local_buf[10] = (char)((ulong)uVar10 >> 0x10);
      local_1a8.field_2._M_local_buf[0xb] = (char)((ulong)uVar10 >> 0x18);
      local_1a8.field_2._M_local_buf[0xc] = (char)((ulong)uVar10 >> 0x20);
      local_1a8.field_2._M_local_buf[0xd] = (char)((ulong)uVar10 >> 0x28);
      local_1a8.field_2._M_local_buf[0xe] = (char)((ulong)uVar10 >> 0x30);
      local_1a8.field_2._M_local_buf[0xf] = (char)((ulong)uVar10 >> 0x38);
      local_1a8._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      uVar7 = *(undefined8 *)pcVar20;
      local_1a8.field_2._M_allocated_capacity._0_2_ = (undefined2)uVar7;
      local_1a8.field_2._M_local_buf[2] = (char)((ulong)uVar7 >> 0x10);
      local_1a8.field_2._M_allocated_capacity._3_2_ = (undefined2)((ulong)uVar7 >> 0x18);
      local_1a8.field_2._M_local_buf[5] = (char)((ulong)uVar7 >> 0x28);
      local_1a8.field_2._M_local_buf[6] = (char)((ulong)uVar7 >> 0x30);
      local_1a8.field_2._M_local_buf[7] = (char)((ulong)uVar7 >> 0x38);
      local_1a8._M_dataplus._M_p = (pointer)*puVar18;
    }
    local_1a8._M_string_length = puVar18[1];
    *puVar18 = pcVar20;
    puVar18[1] = 0;
    *(undefined1 *)(puVar18 + 2) = 0;
    paVar4 = &local_158.field_2;
    local_e8._M_dataplus._M_p = (pointer)0x13;
    local_158._M_dataplus._M_p = (pointer)paVar4;
    local_158._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_158,(ulong)&local_e8);
    local_158.field_2._M_allocated_capacity._0_5_ = SUB85(local_e8._M_dataplus._M_p,0);
    local_158.field_2._M_local_buf[5] = (char)((ulong)local_e8._M_dataplus._M_p >> 0x28);
    local_158.field_2._M_allocated_capacity._6_2_ =
         (undefined2)((ulong)local_e8._M_dataplus._M_p >> 0x30);
    builtin_strncpy(local_158._M_dataplus._M_p,"value_default_value",0x13);
    local_158._M_string_length = (size_type)local_e8._M_dataplus._M_p;
    local_158._M_dataplus._M_p[(long)local_e8._M_dataplus._M_p] = '\0';
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_158);
    std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar4) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar5) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    (anonymous_namespace)::TypeName_abi_cxx11_
              (&local_1a8,(_anonymous_namespace_ *)pFVar17,local_168,(ClassNameResolver *)0x0,
               SUB81(pCVar13,0));
    local_188.field_2._M_allocated_capacity._0_4_ = 0x756c6176;
    local_188.field_2._M_local_buf[4] = 'e';
    local_188.field_2._M_local_buf[5] = '_';
    local_188.field_2._M_local_buf[6] = 'e';
    local_188.field_2._M_local_buf[7] = 'n';
    local_188.field_2._8_2_ = 0x6d75;
    local_188.field_2._M_local_buf[10] = '_';
    local_188.field_2._11_2_ = 0x7974;
    local_188.field_2._M_local_buf[0xd] = 'p';
    local_188.field_2._M_local_buf[0xe] = 'e';
    local_188._M_string_length = 0xf;
    local_188.field_2._M_local_buf[0xf] = '\0';
    local_188._M_dataplus._M_p = (pointer)paVar5;
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_188);
    std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar5) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
    if (*(int *)(*(long *)(local_160 + 0x28) + 0x3c) != 3) {
      DefaultValue_abi_cxx11_
                (&local_1a8,(java *)local_130,(FieldDescriptor *)0x1,SUB81(local_168,0),pCVar13);
      local_158._M_dataplus._M_p = (char *)0x12;
      local_188._M_dataplus._M_p = (pointer)paVar5;
      local_188._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_188,(ulong)&local_158);
      local_188.field_2._M_allocated_capacity._0_4_ = SUB84(local_158._M_dataplus._M_p,0);
      local_188.field_2._M_local_buf[4] = (char)((ulong)local_158._M_dataplus._M_p >> 0x20);
      local_188.field_2._M_local_buf[5] = (char)((ulong)local_158._M_dataplus._M_p >> 0x28);
      local_188.field_2._M_local_buf[6] = (char)((ulong)local_158._M_dataplus._M_p >> 0x30);
      local_188.field_2._M_local_buf[7] = (char)((ulong)local_158._M_dataplus._M_p >> 0x38);
      *(undefined8 *)local_188._M_dataplus._M_p = 0x6e676f6365726e75;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p + 8) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p + 9) = 'z';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p + 10) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p + 0xb) = 'd';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p + 0xc) = '_';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p + 0xd) = 'v';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p + 0xe) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p + 0xf) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p + 0x10) = 'u';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p + 0x11) = 'e';
      local_188._M_string_length = (size_type)local_158._M_dataplus._M_p;
      local_188._M_dataplus._M_p[(long)local_158._M_dataplus._M_p] = '\0';
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](variables,&local_188);
      goto LAB_002d0df8;
    }
    local_188.field_2._M_allocated_capacity._0_4_ = 0x756c6176;
    local_188.field_2._M_local_buf[4] = 'e';
    local_188.field_2._M_local_buf[5] = '_';
    local_188.field_2._M_local_buf[6] = 'e';
    local_188.field_2._M_local_buf[7] = 'n';
    local_188.field_2._8_2_ = 0x6d75;
    local_188.field_2._M_local_buf[10] = '_';
    local_188.field_2._11_2_ = 0x7974;
    local_188.field_2._M_local_buf[0xd] = 'p';
    local_188.field_2._M_local_buf[0xe] = 'e';
    local_188._M_string_length = 0xf;
    local_188.field_2._M_local_buf[0xf] = '\0';
    local_188._M_dataplus._M_p = (pointer)paVar5;
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_188);
    pcVar8 = (pmVar15->_M_dataplus)._M_p;
    local_1a8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a8,pcVar8,pcVar8 + pmVar15->_M_string_length);
    std::__cxx11::string::append((char *)&local_1a8);
    local_e8._M_dataplus._M_p = (pointer)0x12;
    local_158._M_dataplus._M_p = (pointer)paVar4;
    local_158._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_158,(ulong)&local_e8);
    local_158.field_2._M_allocated_capacity._0_5_ = SUB85(local_e8._M_dataplus._M_p,0);
    local_158.field_2._M_local_buf[5] = (char)((ulong)local_e8._M_dataplus._M_p >> 0x28);
    local_158.field_2._M_allocated_capacity._6_2_ =
         (undefined2)((ulong)local_e8._M_dataplus._M_p >> 0x30);
    builtin_strncpy(local_158._M_dataplus._M_p,"unrecognized_value",0x12);
    local_158._M_string_length = (size_type)local_e8._M_dataplus._M_p;
    local_158._M_dataplus._M_p[(long)local_e8._M_dataplus._M_p] = '\0';
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_158);
    std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar4) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
    _Var25._M_p = local_188._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar5) goto LAB_002d0e1b;
  }
  else {
    (anonymous_namespace)::TypeName_abi_cxx11_
              (&local_1a8,(_anonymous_namespace_ *)local_130,local_168,(ClassNameResolver *)0x0,
               SUB81(pCVar13,0));
    local_188.field_2._M_allocated_capacity._0_4_ = 0x756c6176;
    local_188.field_2._M_local_buf[4] = 'e';
    local_188.field_2._M_local_buf[5] = '_';
    local_188.field_2._M_local_buf[6] = 't';
    local_188.field_2._M_local_buf[7] = 'y';
    local_188.field_2._8_2_ = 0x6570;
    local_188._M_string_length = 10;
    local_188.field_2._M_local_buf[10] = '\0';
    local_188._M_dataplus._M_p = (pointer)paVar5;
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_188);
    std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar5) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
    (anonymous_namespace)::TypeName_abi_cxx11_
              (&local_1a8,(_anonymous_namespace_ *)pFVar17,local_168,(ClassNameResolver *)0x1,
               SUB81(pCVar13,0));
    local_158._M_dataplus._M_p = (pointer)0x10;
    local_188._M_dataplus._M_p = (pointer)paVar5;
    local_188._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_188,(ulong)&local_158);
    local_188.field_2._M_allocated_capacity._0_4_ = SUB84(local_158._M_dataplus._M_p,0);
    local_188.field_2._M_local_buf[4] = (char)((ulong)local_158._M_dataplus._M_p >> 0x20);
    local_188.field_2._M_local_buf[5] = (char)((ulong)local_158._M_dataplus._M_p >> 0x28);
    local_188.field_2._M_local_buf[6] = (char)((ulong)local_158._M_dataplus._M_p >> 0x30);
    local_188.field_2._M_local_buf[7] = (char)((ulong)local_158._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_188._M_dataplus._M_p,"boxed_value_type",0x10);
    local_188._M_string_length = (size_type)local_158._M_dataplus._M_p;
    local_188._M_dataplus._M_p[(long)local_158._M_dataplus._M_p] = '\0';
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_188);
    std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_1a8);
    pFVar23 = extraout_RDX_04;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar5) {
      operator_delete(local_188._M_dataplus._M_p);
      pFVar23 = extraout_RDX_05;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a8._M_dataplus._M_p);
      pFVar23 = extraout_RDX_06;
    }
    (anonymous_namespace)::WireType_abi_cxx11_(&local_1a8,(_anonymous_namespace_ *)pFVar17,pFVar23);
    local_188.field_2._M_allocated_capacity._0_4_ = 0x756c6176;
    local_188.field_2._M_local_buf[4] = 'e';
    local_188.field_2._M_local_buf[5] = '_';
    local_188.field_2._M_local_buf[6] = 'w';
    local_188.field_2._M_local_buf[7] = 'i';
    local_188.field_2._8_2_ = 0x6572;
    local_188.field_2._M_local_buf[10] = '_';
    local_188.field_2._11_2_ = 0x7974;
    local_188.field_2._M_local_buf[0xd] = 'p';
    local_188.field_2._M_local_buf[0xe] = 'e';
    local_188._M_string_length = 0xf;
    local_188.field_2._M_local_buf[0xf] = '\0';
    local_188._M_dataplus._M_p = (pointer)paVar5;
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_188);
    std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar5) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
    DefaultValue_abi_cxx11_
              (&local_1a8,(java *)pFVar17,(FieldDescriptor *)0x1,SUB81(local_168,0),pCVar13);
    local_158._M_dataplus._M_p = (char *)0x13;
    local_188._M_dataplus._M_p = (pointer)paVar5;
    local_188._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_188,(ulong)&local_158);
    local_188.field_2._M_allocated_capacity._0_4_ = SUB84(local_158._M_dataplus._M_p,0);
    local_188.field_2._M_local_buf[4] = (char)((ulong)local_158._M_dataplus._M_p >> 0x20);
    local_188.field_2._M_local_buf[5] = (char)((ulong)local_158._M_dataplus._M_p >> 0x28);
    local_188.field_2._M_local_buf[6] = (char)((ulong)local_158._M_dataplus._M_p >> 0x30);
    local_188.field_2._M_local_buf[7] = (char)((ulong)local_158._M_dataplus._M_p >> 0x38);
    *(undefined8 *)local_188._M_dataplus._M_p = 0x65645f65756c6176;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p + 8) = 'f';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p + 9) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p + 10) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p + 0xb) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p + 0xc) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p + 0xd) = '_';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p + 0xe) = 'v';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p + 0xf) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p + 0xf) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p + 0x10) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p + 0x11) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p + 0x12) = 'e';
    local_188._M_string_length = (size_type)local_158._M_dataplus._M_p;
    local_188._M_dataplus._M_p[(long)local_158._M_dataplus._M_p] = '\0';
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_188);
LAB_002d0df8:
    std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar5) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    _Var25._M_p = local_1a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar3) {
LAB_002d0e1b:
      operator_delete(_Var25._M_p);
    }
  }
  paVar4 = &local_158.field_2;
  local_158.field_2._M_allocated_capacity._0_5_ = 0x6465786f62;
  local_158.field_2._M_local_buf[5] = '_';
  local_158.field_2._M_allocated_capacity._6_2_ = 0x656b;
  local_158.field_2._8_5_ = 0x7079745f79;
  local_158.field_2._M_local_buf[0xd] = 'e';
  local_158._M_string_length = 0xe;
  local_158.field_2._M_local_buf[0xe] = '\0';
  local_158._M_dataplus._M_p = (pointer)paVar4;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_158);
  pcVar8 = (pmVar15->_M_dataplus)._M_p;
  local_188._M_dataplus._M_p = (pointer)paVar5;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_188,pcVar8,pcVar8 + pmVar15->_M_string_length);
  std::__cxx11::string::append((char *)&local_188);
  local_128._M_dataplus._M_p = (pointer)0x10;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_e8,(ulong)&local_128);
  local_e8.field_2._M_allocated_capacity = (size_type)local_128._M_dataplus._M_p;
  builtin_strncpy(local_e8._M_dataplus._M_p,"boxed_value_type",0x10);
  local_e8._M_string_length = (size_type)local_128._M_dataplus._M_p;
  local_e8._M_dataplus._M_p[(long)local_128._M_dataplus._M_p] = '\0';
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_e8);
  plVar19 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_188,(ulong)(pmVar15->_M_dataplus)._M_p);
  plVar21 = plVar19 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar19 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar21) {
    lVar9 = *plVar21;
    lVar11 = plVar19[3];
    local_1a8.field_2._M_allocated_capacity._0_2_ = (undefined2)lVar9;
    local_1a8.field_2._M_local_buf[2] = (char)((ulong)lVar9 >> 0x10);
    local_1a8.field_2._M_allocated_capacity._3_2_ = (undefined2)((ulong)lVar9 >> 0x18);
    local_1a8.field_2._M_local_buf[5] = (char)((ulong)lVar9 >> 0x28);
    local_1a8.field_2._M_local_buf[6] = (char)((ulong)lVar9 >> 0x30);
    local_1a8.field_2._M_local_buf[7] = (char)((ulong)lVar9 >> 0x38);
    local_1a8.field_2._M_local_buf[8] = (char)lVar11;
    local_1a8.field_2._M_local_buf[9] = (char)((ulong)lVar11 >> 8);
    local_1a8.field_2._M_local_buf[10] = (char)((ulong)lVar11 >> 0x10);
    local_1a8.field_2._M_local_buf[0xb] = (char)((ulong)lVar11 >> 0x18);
    local_1a8.field_2._M_local_buf[0xc] = (char)((ulong)lVar11 >> 0x20);
    local_1a8.field_2._M_local_buf[0xd] = (char)((ulong)lVar11 >> 0x28);
    local_1a8.field_2._M_local_buf[0xe] = (char)((ulong)lVar11 >> 0x30);
    local_1a8.field_2._M_local_buf[0xf] = (char)((ulong)lVar11 >> 0x38);
    local_1a8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    lVar9 = *plVar21;
    local_1a8.field_2._M_allocated_capacity._0_2_ = (undefined2)lVar9;
    local_1a8.field_2._M_local_buf[2] = (char)((ulong)lVar9 >> 0x10);
    local_1a8.field_2._M_allocated_capacity._3_2_ = (undefined2)((ulong)lVar9 >> 0x18);
    local_1a8.field_2._M_local_buf[5] = (char)((ulong)lVar9 >> 0x28);
    local_1a8.field_2._M_local_buf[6] = (char)((ulong)lVar9 >> 0x30);
    local_1a8.field_2._M_local_buf[7] = (char)((ulong)lVar9 >> 0x38);
    local_1a8._M_dataplus._M_p = (pointer)*plVar19;
  }
  local_1a8._M_string_length = plVar19[1];
  *plVar19 = (long)plVar21;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  local_128.field_2._M_allocated_capacity._0_7_ = 0x61705f65707974;
  local_128.field_2._M_local_buf[7] = 'r';
  local_128.field_2._8_7_ = 0x73726574656d61;
  local_128._M_string_length = 0xf;
  local_128.field_2._M_local_buf[0xf] = '\0';
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_128);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar5) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar4) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  cVar6 = *(char *)(*(long *)(local_160 + 0x78) + 0x4e);
  local_1a8.field_2._M_allocated_capacity._0_2_ = 0x6564;
  local_1a8.field_2._M_local_buf[2] = 'p';
  local_1a8.field_2._M_allocated_capacity._3_2_ = 0x6572;
  local_1a8.field_2._M_local_buf[5] = 'c';
  local_1a8.field_2._M_local_buf[6] = 'a';
  local_1a8.field_2._M_local_buf[7] = 't';
  local_1a8.field_2._M_local_buf[8] = 'i';
  local_1a8.field_2._M_local_buf[9] = 'o';
  local_1a8.field_2._M_local_buf[10] = 'n';
  local_1a8._M_string_length = 0xb;
  local_1a8.field_2._M_local_buf[0xb] = '\0';
  local_1a8._M_dataplus._M_p = (pointer)paVar3;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_1a8);
  pcVar20 = "";
  if (cVar6 != '\0') {
    pcVar20 = "@java.lang.Deprecated ";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,(ulong)pcVar20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  local_1a8.field_2._M_allocated_capacity._0_2_ = 0x6e6f;
  local_1a8.field_2._M_local_buf[2] = '_';
  local_1a8.field_2._M_allocated_capacity._3_2_ = 0x6863;
  local_1a8.field_2._M_local_buf[5] = 'a';
  local_1a8.field_2._M_local_buf[6] = 'n';
  local_1a8.field_2._M_local_buf[7] = 'g';
  local_1a8.field_2._M_local_buf[8] = 'e';
  local_1a8.field_2._M_local_buf[9] = 'd';
  local_1a8._M_string_length = 10;
  local_1a8.field_2._M_local_buf[10] = '\0';
  local_1a8._M_dataplus._M_p = (pointer)paVar3;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_1a8);
  std::__cxx11::string::_M_replace((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x3cd22d);
  iVar22 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a8._M_dataplus._M_p);
    iVar22 = extraout_EDX_00;
  }
  GenerateGetBitMutableLocal_abi_cxx11_(&local_1a8,(java *)(ulong)local_134,iVar22);
  local_158._M_dataplus._M_p = (pointer)0x16;
  local_188._M_dataplus._M_p = (pointer)paVar5;
  local_188._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_188,(ulong)&local_158);
  local_188.field_2._M_allocated_capacity._0_4_ = SUB84(local_158._M_dataplus._M_p,0);
  local_188.field_2._M_local_buf[4] = (char)((ulong)local_158._M_dataplus._M_p >> 0x20);
  local_188.field_2._M_local_buf[5] = (char)((ulong)local_158._M_dataplus._M_p >> 0x28);
  local_188.field_2._M_local_buf[6] = (char)((ulong)local_158._M_dataplus._M_p >> 0x30);
  local_188.field_2._M_local_buf[7] = (char)((ulong)local_158._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_188._M_dataplus._M_p,"get_mutable_bit_parser",0x16);
  local_188._M_string_length = (size_type)local_158._M_dataplus._M_p;
  local_188._M_dataplus._M_p[(long)local_158._M_dataplus._M_p] = '\0';
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_188);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_1a8);
  iVar22 = extraout_EDX_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar5) {
    operator_delete(local_188._M_dataplus._M_p);
    iVar22 = extraout_EDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a8._M_dataplus._M_p);
    iVar22 = extraout_EDX_03;
  }
  GenerateSetBitMutableLocal_abi_cxx11_(&local_1a8,(java *)(ulong)local_134,iVar22);
  local_158._M_dataplus._M_p = (pointer)0x16;
  local_188._M_dataplus._M_p = (pointer)paVar5;
  local_188._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_188,(ulong)&local_158);
  local_188.field_2._M_allocated_capacity._0_4_ = SUB84(local_158._M_dataplus._M_p,0);
  local_188.field_2._M_local_buf[4] = (char)((ulong)local_158._M_dataplus._M_p >> 0x20);
  local_188.field_2._M_local_buf[5] = (char)((ulong)local_158._M_dataplus._M_p >> 0x28);
  local_188.field_2._M_local_buf[6] = (char)((ulong)local_158._M_dataplus._M_p >> 0x30);
  local_188.field_2._M_local_buf[7] = (char)((ulong)local_158._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_188._M_dataplus._M_p,"set_mutable_bit_parser",0x16);
  local_188._M_string_length = (size_type)local_158._M_dataplus._M_p;
  local_188._M_dataplus._M_p[(long)local_158._M_dataplus._M_p] = '\0';
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_188);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar5) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  local_158._M_dataplus._M_p = (pointer)0x10;
  local_188._M_dataplus._M_p = (pointer)paVar5;
  local_188._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_188,(ulong)&local_158);
  local_188.field_2._M_allocated_capacity._0_4_ = SUB84(local_158._M_dataplus._M_p,0);
  local_188.field_2._M_local_buf[4] = (char)((ulong)local_158._M_dataplus._M_p >> 0x20);
  local_188.field_2._M_local_buf[5] = (char)((ulong)local_158._M_dataplus._M_p >> 0x28);
  local_188.field_2._M_local_buf[6] = (char)((ulong)local_158._M_dataplus._M_p >> 0x30);
  local_188.field_2._M_local_buf[7] = (char)((ulong)local_158._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_188._M_dataplus._M_p,"capitalized_name",0x10);
  local_188._M_string_length = (size_type)local_158._M_dataplus._M_p;
  local_188._M_dataplus._M_p[(long)local_158._M_dataplus._M_p] = '\0';
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_188);
  pcVar8 = (pmVar15->_M_dataplus)._M_p;
  local_1a8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,pcVar8,pcVar8 + pmVar15->_M_string_length);
  std::__cxx11::string::append((char *)&local_1a8);
  local_158.field_2._M_allocated_capacity._0_5_ = 0x7561666564;
  local_158.field_2._M_local_buf[5] = 'l';
  local_158.field_2._M_allocated_capacity._6_2_ = 0x5f74;
  local_158.field_2._8_5_ = 0x7972746e65;
  local_158._M_string_length = 0xd;
  local_158.field_2._M_local_buf[0xd] = '\0';
  local_158._M_dataplus._M_p = (pointer)paVar4;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_158);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar4) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar5) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  local_1a8.field_2._M_allocated_capacity._0_2_ = 0x6564;
  local_1a8.field_2._M_local_buf[2] = 'f';
  local_1a8.field_2._M_allocated_capacity._3_2_ = 0x7561;
  local_1a8.field_2._M_local_buf[5] = 'l';
  local_1a8.field_2._M_local_buf[6] = 't';
  local_1a8.field_2._M_local_buf[7] = '_';
  local_1a8.field_2._M_local_buf[8] = 'e';
  local_1a8.field_2._M_local_buf[9] = 'n';
  local_1a8.field_2._M_local_buf[10] = 't';
  local_1a8.field_2._M_local_buf[0xb] = 'r';
  local_1a8.field_2._M_local_buf[0xc] = 'y';
  local_1a8._M_string_length = 0xd;
  local_1a8.field_2._M_local_buf[0xd] = '\0';
  local_1a8._M_dataplus._M_p = (pointer)paVar3;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](variables,&local_1a8);
  local_158._M_dataplus._M_p = (pointer)0x13;
  local_188._M_dataplus._M_p = (pointer)paVar5;
  local_188._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_188,(ulong)&local_158);
  local_188.field_2._M_allocated_capacity._0_4_ = SUB84(local_158._M_dataplus._M_p,0);
  local_188.field_2._M_local_buf[4] = (char)((ulong)local_158._M_dataplus._M_p >> 0x20);
  local_188.field_2._M_local_buf[5] = (char)((ulong)local_158._M_dataplus._M_p >> 0x28);
  local_188.field_2._M_local_buf[6] = (char)((ulong)local_158._M_dataplus._M_p >> 0x30);
  local_188.field_2._M_local_buf[7] = (char)((ulong)local_158._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_188._M_dataplus._M_p,"map_field_parameter",0x13);
  local_188._M_string_length = (size_type)local_158._M_dataplus._M_p;
  local_188._M_dataplus._M_p[(long)local_158._M_dataplus._M_p] = '\0';
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_188);
  std::__cxx11::string::_M_assign((string *)pmVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar5) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_e8,(ClassNameResolver *)local_168,*(FileDescriptor **)(local_160 + 0x28),true);
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_e8);
  plVar21 = plVar19 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar19 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar21) {
    lVar9 = *plVar21;
    lVar11 = plVar19[3];
    local_158.field_2._M_allocated_capacity._0_5_ = (undefined5)lVar9;
    local_158.field_2._M_local_buf[5] = (char)((ulong)lVar9 >> 0x28);
    local_158.field_2._M_allocated_capacity._6_2_ = (undefined2)((ulong)lVar9 >> 0x30);
    local_158.field_2._8_5_ = (undefined5)lVar11;
    local_158.field_2._M_local_buf[0xd] = (char)((ulong)lVar11 >> 0x28);
    local_158.field_2._M_local_buf[0xe] = (char)((ulong)lVar11 >> 0x30);
    local_158.field_2._M_local_buf[0xf] = (char)((ulong)lVar11 >> 0x38);
    local_158._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    lVar9 = *plVar21;
    local_158.field_2._M_allocated_capacity._0_5_ = (undefined5)lVar9;
    local_158.field_2._M_local_buf[5] = (char)((ulong)lVar9 >> 0x28);
    local_158.field_2._M_allocated_capacity._6_2_ = (undefined2)((ulong)lVar9 >> 0x30);
    local_158._M_dataplus._M_p = (pointer)*plVar19;
  }
  local_158._M_string_length = plVar19[1];
  *plVar19 = (long)plVar21;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  pDVar14 = FieldDescriptor::message_type(local_160);
  UniqueFileScopeIdentifier_abi_cxx11_(&local_128,(java *)pDVar14,descriptor_00);
  uVar24 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar4) {
    uVar24 = CONCAT26(local_158.field_2._M_allocated_capacity._6_2_,
                      CONCAT15(local_158.field_2._M_local_buf[5],
                               local_158.field_2._M_allocated_capacity._0_5_));
  }
  if (uVar24 < local_128._M_string_length + local_158._M_string_length) {
    uVar24 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      uVar24 = CONCAT17(local_128.field_2._M_local_buf[7],
                        local_128.field_2._M_allocated_capacity._0_7_);
    }
    if (local_128._M_string_length + local_158._M_string_length <= uVar24) {
      puVar18 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_128,0,(char *)0x0,(ulong)local_158._M_dataplus._M_p);
      goto LAB_002d1431;
    }
  }
  puVar18 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_128._M_dataplus._M_p);
LAB_002d1431:
  puVar2 = puVar18 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar18 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    uVar7 = *puVar2;
    uVar10 = puVar18[3];
    local_188.field_2._M_allocated_capacity._0_4_ = (undefined4)uVar7;
    local_188.field_2._M_local_buf[4] = (char)((ulong)uVar7 >> 0x20);
    local_188.field_2._M_local_buf[5] = (char)((ulong)uVar7 >> 0x28);
    local_188.field_2._M_local_buf[6] = (char)((ulong)uVar7 >> 0x30);
    local_188.field_2._M_local_buf[7] = (char)((ulong)uVar7 >> 0x38);
    local_188.field_2._8_2_ = (undefined2)uVar10;
    local_188.field_2._M_local_buf[10] = (char)((ulong)uVar10 >> 0x10);
    local_188.field_2._11_2_ = (undefined2)((ulong)uVar10 >> 0x18);
    local_188.field_2._M_local_buf[0xd] = (char)((ulong)uVar10 >> 0x28);
    local_188.field_2._M_local_buf[0xe] = (char)((ulong)uVar10 >> 0x30);
    local_188.field_2._M_local_buf[0xf] = (char)((ulong)uVar10 >> 0x38);
    local_188._M_dataplus._M_p = (pointer)paVar5;
  }
  else {
    uVar7 = *puVar2;
    local_188.field_2._M_allocated_capacity._0_4_ = (undefined4)uVar7;
    local_188.field_2._M_local_buf[4] = (char)((ulong)uVar7 >> 0x20);
    local_188.field_2._M_local_buf[5] = (char)((ulong)uVar7 >> 0x28);
    local_188.field_2._M_local_buf[6] = (char)((ulong)uVar7 >> 0x30);
    local_188.field_2._M_local_buf[7] = (char)((ulong)uVar7 >> 0x38);
    local_188._M_dataplus._M_p = (pointer)*puVar18;
  }
  local_188._M_string_length = puVar18[1];
  *puVar18 = puVar2;
  puVar18[1] = 0;
  *(undefined1 *)puVar2 = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_188);
  plVar21 = plVar19 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar19 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar21) {
    lVar9 = *plVar21;
    lVar11 = plVar19[3];
    local_1a8.field_2._M_allocated_capacity._0_2_ = (undefined2)lVar9;
    local_1a8.field_2._M_local_buf[2] = (char)((ulong)lVar9 >> 0x10);
    local_1a8.field_2._M_allocated_capacity._3_2_ = (undefined2)((ulong)lVar9 >> 0x18);
    local_1a8.field_2._M_local_buf[5] = (char)((ulong)lVar9 >> 0x28);
    local_1a8.field_2._M_local_buf[6] = (char)((ulong)lVar9 >> 0x30);
    local_1a8.field_2._M_local_buf[7] = (char)((ulong)lVar9 >> 0x38);
    local_1a8.field_2._M_local_buf[8] = (char)lVar11;
    local_1a8.field_2._M_local_buf[9] = (char)((ulong)lVar11 >> 8);
    local_1a8.field_2._M_local_buf[10] = (char)((ulong)lVar11 >> 0x10);
    local_1a8.field_2._M_local_buf[0xb] = (char)((ulong)lVar11 >> 0x18);
    local_1a8.field_2._M_local_buf[0xc] = (char)((ulong)lVar11 >> 0x20);
    local_1a8.field_2._M_local_buf[0xd] = (char)((ulong)lVar11 >> 0x28);
    local_1a8.field_2._M_local_buf[0xe] = (char)((ulong)lVar11 >> 0x30);
    local_1a8.field_2._M_local_buf[0xf] = (char)((ulong)lVar11 >> 0x38);
    local_1a8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    lVar9 = *plVar21;
    local_1a8.field_2._M_allocated_capacity._0_2_ = (undefined2)lVar9;
    local_1a8.field_2._M_local_buf[2] = (char)((ulong)lVar9 >> 0x10);
    local_1a8.field_2._M_allocated_capacity._3_2_ = (undefined2)((ulong)lVar9 >> 0x18);
    local_1a8.field_2._M_local_buf[5] = (char)((ulong)lVar9 >> 0x28);
    local_1a8.field_2._M_local_buf[6] = (char)((ulong)lVar9 >> 0x30);
    local_1a8.field_2._M_local_buf[7] = (char)((ulong)lVar9 >> 0x38);
    local_1a8._M_dataplus._M_p = (pointer)*plVar19;
  }
  local_1a8._M_string_length = plVar19[1];
  *plVar19 = (long)plVar21;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  local_50.field_2._M_allocated_capacity = 0x7470697263736564;
  local_50.field_2._8_2_ = 0x726f;
  local_50._M_string_length = 10;
  local_50.field_2._M_local_buf[10] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_50);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar5) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar4) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_1a8.field_2._M_allocated_capacity._0_2_ = 0x3356;
  local_1a8._M_string_length = 2;
  local_1a8.field_2._M_local_buf[2] = '\0';
  local_188.field_2._M_allocated_capacity._0_4_ = 0x726576;
  local_188._M_string_length = 3;
  local_1a8._M_dataplus._M_p = (pointer)paVar3;
  local_188._M_dataplus._M_p = (pointer)paVar5;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_188);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar5) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  return;
}

Assistant:

ImmutableMapFieldGenerator::ImmutableMapFieldGenerator(
    const FieldDescriptor* descriptor, int messageBitIndex, int builderBitIndex,
    Context* context)
    : descriptor_(descriptor), name_resolver_(context->GetNameResolver()) {
  SetMessageVariables(descriptor, messageBitIndex, builderBitIndex,
                      context->GetFieldGeneratorInfo(descriptor), context,
                      &variables_);
}